

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDMesh * __thiscall ON_SubDMesh::CopyFrom(ON_SubDMesh *this,ON_SubDMesh *src)

{
  ON_SubDMeshImpl *src_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ON_SubDMeshImpl *this_00;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (this != src) {
    std::__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)this);
    src_00 = (src->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (src_00 != (ON_SubDMeshImpl *)0x0) {
      this_00 = (ON_SubDMeshImpl *)operator_new(0xc0);
      ON_SubDMeshImpl::ON_SubDMeshImpl(this_00,src_00);
      std::__shared_ptr<ON_SubDMeshImpl,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ON_SubDMeshImpl,void>
                ((__shared_ptr<ON_SubDMeshImpl,(__gnu_cxx::_Lock_policy)2> *)&local_28,this_00);
      peVar1 = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var2 = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_28;
      (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_20._M_pi;
      local_28 = peVar1;
      _Stack_20._M_pi = p_Var2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
    }
  }
  return this;
}

Assistant:

ON_SubDMesh& ON_SubDMesh::CopyFrom(
  const ON_SubDMesh& src
  )
{
  if (this != &src)
  {
    m_impl_sp.reset();
    const ON_SubDMeshImpl* src_impl = src.m_impl_sp.get();
    if (nullptr != src_impl)
    {
      ON_SubDMeshImpl* impl = new ON_SubDMeshImpl(*src_impl);
      std::shared_ptr< ON_SubDMeshImpl > new_impl_sp(impl);
      m_impl_sp.swap(new_impl_sp);
    }
  }
  return *this;
}